

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

ostream * operator<<(ostream *os,Graph<Node> *g)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  
  std::operator<<(os,"Graph:\n\n");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,g->_nodeCnt);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,g->_edgeCnt);
  std::operator<<(poVar1,'\n');
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < g->_edgeCnt; lVar3 = lVar3 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)os,*(int *)((long)&((g->edges).vect)->_nodeS + lVar2));
    poVar1 = std::operator<<(poVar1,' ');
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,*(int *)((long)&((g->edges).vect)->_nodeD + lVar2));
    poVar1 = std::operator<<(poVar1,' ');
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,*(int *)((long)&((g->edges).vect)->_cost + lVar2));
    std::operator<<(poVar1,'\n');
    lVar2 = lVar2 + 0xc;
  }
  std::operator<<(os,"------------------------\n\n");
  return os;
}

Assistant:

std::ostream &operator << (std::ostream &os, const Graph <NodeT> &g) {
        os << "Graph:\n\n";
        os << g._nodeCnt << ' ' << g._edgeCnt << '\n';
        for (int i = 0; i < g._edgeCnt; ++i) {
            os << g.getEdge(i).getSource() << ' ' << g.getEdge(i).getDest() << ' ' << g.getEdge(i).getCost() << '\n';
        }

        os << "------------------------\n\n";
        return os;
    }